

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileTests.cpp
# Opt level: O3

void __thiscall
solitaire::piles::TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test
::~TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test
          (TableauPileWithUncoveredTopCardTest_tryAddCardsWhenFirstCardColorIsIncorrect_Test *this)

{
  pointer pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_TableauPileWithUncoveredTopCardTest).super_InitializedTableauPileTest.
  super_EmptyTableauPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__TableauPileWithUncoveredTopCardTest_0032c728;
  pCVar1 = (this->super_TableauPileWithUncoveredTopCardTest).cardsToAdd.
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->super_TableauPileWithUncoveredTopCardTest).cardsToAdd.
                                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  (this->super_TableauPileWithUncoveredTopCardTest).super_InitializedTableauPileTest.
  super_EmptyTableauPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InitializedTableauPileTest_0032c768;
  pCVar1 = (this->super_TableauPileWithUncoveredTopCardTest).super_InitializedTableauPileTest.
           pileCards.
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->super_TableauPileWithUncoveredTopCardTest).
                                 super_InitializedTableauPileTest.pileCards.
                                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  (this->super_TableauPileWithUncoveredTopCardTest).super_InitializedTableauPileTest.
  super_EmptyTableauPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__EmptyTableauPileTest_0032c4e8;
  this_00 = (this->super_TableauPileWithUncoveredTopCardTest).super_InitializedTableauPileTest.
            super_EmptyTableauPileTest.pile.
            super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TEST_F(TableauPileWithUncoveredTopCardTest,
       tryAddCardsWhenFirstCardColorIsIncorrect)
{
    cardsToAdd.front() = Card {cardsToAdd.front().getValue(), Suit::Diamond};
    const auto cardsLeftAfterAdding = cardsToAdd;

    pile->tryAddCards(cardsToAdd);

    EXPECT_THAT(cardsToAdd, ContainerEq(cardsLeftAfterAdding));
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}